

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrmem.c
# Opt level: O1

int mem_createmem(size_t msize,int *handle)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  memdriver *pmVar4;
  
  *handle = -1;
  pmVar4 = memTable;
  lVar2 = 0;
  do {
    if (pmVar4->memaddrptr == (char **)0x0) {
      *handle = (int)lVar2;
      goto LAB_0013226c;
    }
    lVar2 = lVar2 + 1;
    pmVar4 = pmVar4 + 1;
  } while (lVar2 != 10000);
  lVar2 = 10000;
LAB_0013226c:
  if (*handle == -1) {
    iVar1 = 0x67;
  }
  else {
    memTable[lVar2].memaddrptr = &memTable[lVar2].memaddr;
    memTable[lVar2].memsizeptr = (size_t *)(lVar2 * 0x48 + 0x298838);
    if (msize != 0) {
      pcVar3 = (char *)malloc(msize);
      memTable[lVar2].memaddr = pcVar3;
      if (pcVar3 == (char *)0x0) {
        ffpmsg("malloc of initial memory failed (mem_createmem)");
        return 0x68;
      }
    }
    memTable[lVar2].memsize = msize;
    memTable[lVar2].deltasize = 0xb40;
    memTable[lVar2].currentpos = 0;
    memTable[lVar2].fitsfilesize = 0;
    memTable[lVar2].mem_realloc = realloc;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int mem_createmem(size_t msize, int *handle)
/* 
  lowest level routine to allocate a memory file.
*/
{
    int ii;

    *handle = -1;
    for (ii = 0; ii < NMAXFILES; ii++)  /* find empty slot in handle table */
    {
        if (memTable[ii].memaddrptr == 0)
        {
            *handle = ii;
            break;
        }
    }
    if (*handle == -1)
       return(TOO_MANY_FILES);    /* too many files opened */

    /* use the internally allocated memaddr and memsize variables */
    memTable[ii].memaddrptr = &memTable[ii].memaddr;
    memTable[ii].memsizeptr = &memTable[ii].memsize;

    /* allocate initial block of memory for the file */
    if (msize > 0)
    {
        memTable[ii].memaddr = (char *) malloc(msize); 
        if ( !(memTable[ii].memaddr) )
        {
            ffpmsg("malloc of initial memory failed (mem_createmem)");
            return(FILE_NOT_OPENED);
        }
    }

    /* set initial state of the file */
    memTable[ii].memsize = msize;
    memTable[ii].deltasize = 2880;
    memTable[ii].fitsfilesize = 0;
    memTable[ii].currentpos = 0;
    memTable[ii].mem_realloc = realloc;
    return(0);
}